

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_bind_error_inval(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *__s;
  undefined8 unaff_RBX;
  long *plVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  code *pcStack_f90;
  long lStack_f88;
  long lStack_f80;
  long alStack_f78 [13];
  undefined1 auStack_f10 [232];
  long alStack_e28 [64];
  code *pcStack_c28;
  long lStack_c18;
  long lStack_c10;
  undefined1 auStack_c08 [232];
  code *pcStack_b20;
  long lStack_b10;
  long lStack_b08;
  undefined1 auStack_b00 [232];
  undefined1 auStack_a18 [2047];
  undefined1 uStack_219;
  code *pcStack_218;
  long lStack_208;
  long lStack_200;
  undefined1 auStack_1f8 [232];
  code *pcStack_110;
  long local_100;
  long local_f8;
  undefined1 local_f0 [232];
  
  pcStack_110 = (code *)0x1b0296;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x1b02a5;
  iVar1 = uv_pipe_init(uVar2,local_f0,0);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    pcStack_110 = (code *)0x1b02d6;
    iVar1 = uv_pipe_bind(local_f0,"/tmp/uv-test-sock");
    local_f8 = (long)iVar1;
    local_100 = 0;
    if (local_f8 != 0) goto LAB_001b03d7;
    pcStack_110 = (code *)0x1b0307;
    iVar1 = uv_pipe_bind(local_f0,"/tmp/uv-test-sock2");
    local_f8 = (long)iVar1;
    local_100 = -0x16;
    if (local_f8 != -0x16) goto LAB_001b03e6;
    pcStack_110 = (code *)0x1b0338;
    uv_close(local_f0,close_cb);
    pcStack_110 = (code *)0x1b033d;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b0347;
    uv_run(uVar2,0);
    local_f8 = 1;
    local_100 = (long)close_cb_called;
    if (local_100 != 1) goto LAB_001b03f5;
    pcStack_110 = (code *)0x1b0371;
    unaff_RBX = uv_default_loop();
    pcStack_110 = (code *)0x1b0385;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1b038f;
    uv_run(unaff_RBX,0);
    local_f8 = 0;
    pcStack_110 = (code *)0x1b039d;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b03a5;
    iVar1 = uv_loop_close(uVar2);
    local_100 = (long)iVar1;
    if (local_f8 == local_100) {
      pcStack_110 = (code *)0x1b03bd;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1b03d7;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001b03d7:
    pcStack_110 = (code *)0x1b03e6;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001b03e6:
    pcStack_110 = (code *)0x1b03f5;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001b03f5:
    pcStack_110 = (code *)0x1b0404;
    run_test_pipe_bind_error_inval_cold_4();
  }
  pcStack_110 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  pcStack_218 = (code *)0x1b0420;
  pcStack_110 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_218 = (code *)0x1b042f;
  iVar1 = uv_pipe_init(uVar2,auStack_1f8,0);
  lStack_200 = (long)iVar1;
  lStack_208 = 0;
  if (lStack_200 == 0) {
    pcStack_218 = (code *)0x1b0460;
    iVar1 = uv_listen(auStack_1f8,0x1000,0);
    lStack_200 = (long)iVar1;
    lStack_208 = -0x16;
    if (lStack_200 != -0x16) goto LAB_001b052c;
    pcStack_218 = (code *)0x1b0491;
    uv_close(auStack_1f8,close_cb);
    pcStack_218 = (code *)0x1b0496;
    uVar2 = uv_default_loop();
    pcStack_218 = (code *)0x1b04a0;
    uv_run(uVar2,0);
    lStack_200 = 1;
    lStack_208 = (long)close_cb_called;
    if (lStack_208 != 1) goto LAB_001b053b;
    pcStack_218 = (code *)0x1b04c6;
    unaff_RBX = uv_default_loop();
    pcStack_218 = (code *)0x1b04da;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_218 = (code *)0x1b04e4;
    uv_run(unaff_RBX,0);
    lStack_200 = 0;
    pcStack_218 = (code *)0x1b04f2;
    uVar2 = uv_default_loop();
    pcStack_218 = (code *)0x1b04fa;
    iVar1 = uv_loop_close(uVar2);
    lStack_208 = (long)iVar1;
    if (lStack_200 == lStack_208) {
      pcStack_218 = (code *)0x1b0512;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_218 = (code *)0x1b052c;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001b052c:
    pcStack_218 = (code *)0x1b053b;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001b053b:
    pcStack_218 = (code *)0x1b054a;
    run_test_pipe_listen_without_bind_cold_3();
  }
  pcStack_218 = run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  __s = auStack_a18;
  pcStack_b20 = (code *)0x1b057b;
  pcStack_218 = (code *)unaff_RBX;
  memset(__s,0x2e,0x7ff);
  uStack_219 = 0;
  pcStack_b20 = (code *)0x1b0587;
  uVar2 = uv_default_loop();
  pcStack_b20 = (code *)0x1b0596;
  iVar1 = uv_pipe_init(uVar2,auStack_b00,0);
  if (iVar1 == 0) {
    pcStack_b20 = (code *)0x1b05b0;
    iVar1 = uv_pipe_bind(auStack_b00,auStack_a18);
    if (iVar1 != -0x24) goto LAB_001b0643;
    pcStack_b20 = (code *)0x1b05ca;
    uv_close(auStack_b00,close_cb);
    pcStack_b20 = (code *)0x1b05cf;
    uVar2 = uv_default_loop();
    pcStack_b20 = (code *)0x1b05d9;
    uv_run(uVar2,0);
    if (close_cb_called != 1) goto LAB_001b0648;
    pcStack_b20 = (code *)0x1b05e7;
    __s = (undefined1 *)uv_default_loop();
    pcStack_b20 = (code *)0x1b05fb;
    uv_walk(__s,close_walk_cb,0);
    pcStack_b20 = (code *)0x1b0605;
    uv_run(__s,0);
    lStack_b08 = 0;
    pcStack_b20 = (code *)0x1b0613;
    uVar2 = uv_default_loop();
    pcStack_b20 = (code *)0x1b061b;
    iVar1 = uv_loop_close(uVar2);
    lStack_b10 = (long)iVar1;
    if (lStack_b08 == lStack_b10) {
      pcStack_b20 = (code *)0x1b0633;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_b20 = (code *)0x1b0643;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001b0643:
    pcStack_b20 = (code *)0x1b0648;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001b0648:
    pcStack_b20 = (code *)0x1b064d;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  pcStack_b20 = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  pcStack_c28 = (code *)0x1b0669;
  pcStack_b20 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_c28 = (code *)0x1b0678;
  iVar1 = uv_pipe_init(uVar2,auStack_c08,0);
  lStack_c10 = (long)iVar1;
  lStack_c18 = 0;
  if (lStack_c10 == 0) {
    __s = auStack_c08;
    pcStack_c28 = (code *)0x1b06a7;
    uv_close(__s,0);
    pcStack_c28 = (code *)0x1b06b6;
    iVar1 = uv_pipe_bind(__s,"/tmp/uv-test-sock");
    lStack_c10 = (long)iVar1;
    lStack_c18 = -0x16;
    if (lStack_c10 != -0x16) goto LAB_001b07a1;
    pcStack_c28 = (code *)0x1b06e7;
    iVar1 = uv_listen(auStack_c08,0x1000,0);
    lStack_c10 = (long)iVar1;
    lStack_c18 = -0x16;
    if (lStack_c10 != -0x16) goto LAB_001b07b0;
    pcStack_c28 = (code *)0x1b070c;
    uVar2 = uv_default_loop();
    pcStack_c28 = (code *)0x1b0716;
    iVar1 = uv_run(uVar2,0);
    lStack_c10 = (long)iVar1;
    lStack_c18 = 0;
    if (lStack_c10 != 0) goto LAB_001b07bf;
    pcStack_c28 = (code *)0x1b073b;
    __s = (undefined1 *)uv_default_loop();
    pcStack_c28 = (code *)0x1b074f;
    uv_walk(__s,close_walk_cb,0);
    pcStack_c28 = (code *)0x1b0759;
    uv_run(__s,0);
    lStack_c10 = 0;
    pcStack_c28 = (code *)0x1b0767;
    uVar2 = uv_default_loop();
    pcStack_c28 = (code *)0x1b076f;
    iVar1 = uv_loop_close(uVar2);
    lStack_c18 = (long)iVar1;
    if (lStack_c10 == lStack_c18) {
      pcStack_c28 = (code *)0x1b0787;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_c28 = (code *)0x1b07a1;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001b07a1:
    pcStack_c28 = (code *)0x1b07b0;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001b07b0:
    pcStack_c28 = (code *)0x1b07bf;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001b07bf:
    pcStack_c28 = (code *)0x1b07ce;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  pcStack_c28 = run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  plVar3 = &lStack_f88;
  pcStack_f90 = (code *)0x1b07ea;
  pcStack_c28 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_f90 = (code *)0x1b07f9;
  iVar1 = uv_pipe_init(uVar2,auStack_f10,0);
  alStack_e28[0] = (long)iVar1;
  alStack_f78[0] = 0;
  if (alStack_e28[0] == 0) {
    pcStack_f90 = (code *)0x1b0839;
    memset(alStack_e28,0x40,0x200);
    alStack_f78[0] = -0x24;
    pcStack_f90 = (code *)0x1b0859;
    iVar1 = uv_pipe_bind2(auStack_f10,alStack_e28,0x200,1);
    lStack_f88 = (long)iVar1;
    if (alStack_f78[0] != lStack_f88) goto LAB_001b0a0d;
    lStack_f88 = -0x24;
    pcStack_f90 = (code *)0x1b089f;
    iVar1 = uv_pipe_connect2(alStack_f78,auStack_f10,alStack_e28,0x200,1,abort);
    lStack_f80 = (long)iVar1;
    if (lStack_f88 != lStack_f80) goto LAB_001b0a1a;
    pcStack_f90 = (code *)0x1b08ba;
    uVar2 = uv_default_loop();
    pcStack_f90 = (code *)0x1b08c4;
    iVar1 = uv_run(uVar2,0);
    lStack_f88 = (long)iVar1;
    lStack_f80 = 0;
    if (lStack_f88 != 0) goto LAB_001b0a27;
    lStack_f88 = -0x16;
    pcStack_f90 = (code *)0x1b08fb;
    iVar1 = uv_pipe_bind(auStack_f10,"");
    lStack_f80 = (long)iVar1;
    if (lStack_f88 != lStack_f80) goto LAB_001b0a34;
    pcStack_f90 = (code *)0x1b092e;
    uv_pipe_connect(alStack_f78,auStack_f10,"",connect_overlong_cb);
    pcStack_f90 = (code *)0x1b0933;
    uVar2 = uv_default_loop();
    pcStack_f90 = (code *)0x1b093d;
    iVar1 = uv_run(uVar2,0);
    lStack_f88 = (long)iVar1;
    lStack_f80 = 0;
    if (lStack_f88 != 0) goto LAB_001b0a41;
    lStack_f88 = 1;
    lStack_f80 = (long)connect_cb_called;
    if (lStack_f80 != 1) goto LAB_001b0a4e;
    lStack_f88 = 1;
    lStack_f80 = (long)close_cb_called;
    if (lStack_f80 == 1) {
      pcStack_f90 = (code *)0x1b09a6;
      uVar2 = uv_default_loop();
      pcStack_f90 = (code *)0x1b09ba;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_f90 = (code *)0x1b09c4;
      uv_run(uVar2,0);
      lStack_f88 = 0;
      pcStack_f90 = (code *)0x1b09d1;
      uVar2 = uv_default_loop();
      pcStack_f90 = (code *)0x1b09d9;
      iVar1 = uv_loop_close(uVar2);
      lStack_f80 = (long)iVar1;
      if (lStack_f88 == lStack_f80) {
        pcStack_f90 = (code *)0x1b09f0;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b0a68;
    }
  }
  else {
    pcStack_f90 = (code *)0x1b0a0d;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0a0d:
    pcStack_f90 = (code *)0x1b0a1a;
    run_test_pipe_overlong_path_cold_2();
LAB_001b0a1a:
    pcStack_f90 = (code *)0x1b0a27;
    run_test_pipe_overlong_path_cold_3();
LAB_001b0a27:
    pcStack_f90 = (code *)0x1b0a34;
    run_test_pipe_overlong_path_cold_4();
LAB_001b0a34:
    pcStack_f90 = (code *)0x1b0a41;
    run_test_pipe_overlong_path_cold_5();
LAB_001b0a41:
    pcStack_f90 = (code *)0x1b0a4e;
    run_test_pipe_overlong_path_cold_6();
LAB_001b0a4e:
    pcStack_f90 = (code *)0x1b0a5b;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_f90 = (code *)0x1b0a68;
  run_test_pipe_overlong_path_cold_8();
LAB_001b0a68:
  iVar1 = (int)&lStack_f80;
  pcStack_f90 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_f90 = (code *)(long)iVar1;
  if (pcStack_f90 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)((long)plVar3 + 0x50),close_cb);
    return iVar1;
  }
  ppcVar4 = &pcStack_f90;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_bind_error_inval) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server, TEST_PIPENAME);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server, TEST_PIPENAME_2);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}